

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall serialize_tests::sizes::test_method(sizes *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  lazy_ostream local_f0;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined8 *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  undefined8 **local_90;
  undefined8 *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  undefined8 **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4d;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_88 = &local_f8;
  local_f8 = 1;
  local_b0 = &local_100;
  local_100 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_68 = &local_88;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_a0 = 0;
  local_90 = &local_b0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10358,(size_t)&local_60,0x4d,&local_80,
             "GetSerializeSize((unsigned char)0)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4e;
  file_00.m_begin = (iterator)&local_110;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 1;
  local_100 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10391,(size_t)&local_60,0x4e,&local_80,
             "GetSerializeSize(int8_t(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4f;
  file_01.m_begin = (iterator)&local_130;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_140,
             msg_01);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 1;
  local_100 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf103bc,(size_t)&local_60,0x4f,&local_80,
             "GetSerializeSize(uint8_t(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000050;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 2;
  local_100 = 2;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf103e9,(size_t)&local_60,0x50,&local_80,
             "GetSerializeSize(int16_t(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_170;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_180,
             msg_03);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 2;
  local_100 = 2;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10416,(size_t)&local_60,0x51,&local_80,
             "GetSerializeSize(uint16_t(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x52;
  file_04.m_begin = (iterator)&local_190;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1a0,
             msg_04);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 4;
  local_100 = 4;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10445,(size_t)&local_60,0x52,&local_80,
             "GetSerializeSize(int32_t(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x53;
  file_05.m_begin = (iterator)&local_1b0;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c0,
             msg_05);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 4;
  local_100 = 4;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10472,(size_t)&local_60,0x53,&local_80,
             "GetSerializeSize(uint32_t(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x54;
  file_06.m_begin = (iterator)&local_1d0;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1e0,
             msg_06);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 8;
  local_100 = 8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf104a1,(size_t)&local_60,0x54,&local_80,
             "GetSerializeSize(int64_t(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x55;
  file_07.m_begin = (iterator)&local_1f0;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_200,
             msg_07);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 8;
  local_100 = 8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf104ce,(size_t)&local_60,0x55,&local_80,
             "GetSerializeSize(uint64_t(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x57;
  file_08.m_begin = (iterator)&local_210;
  msg_08.m_end = pvVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_220,
             msg_08);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 1;
  local_100 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae0c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf103bc,(size_t)&local_60,0x57,&local_80,
             "GetSerializeSize(bool(0))",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x5a;
  file_09.m_begin = (iterator)&local_230;
  msg_09.m_end = pvVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_240,
             msg_09);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 1;
  local_100._0_4_ = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf1036e,(size_t)&local_60,0x5a,&local_80,"1U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x5b;
  file_10.m_begin = (iterator)&local_250;
  msg_10.m_end = pvVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_260,
             msg_10);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 1;
  local_100._0_4_ = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf103a0,(size_t)&local_60,0x5b,&local_80,"1U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x5c;
  file_11.m_begin = (iterator)&local_270;
  msg_11.m_end = pvVar2;
  msg_11.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_280,
             msg_11);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 1;
  local_100._0_4_ = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf103cc,(size_t)&local_60,0x5c,&local_80,"1U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x5d;
  file_12.m_begin = (iterator)&local_290;
  msg_12.m_end = pvVar2;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_2a0,
             msg_12);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 2;
  local_100._0_4_ = 2;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf103f9,(size_t)&local_60,0x5d,&local_80,"2U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x5e;
  file_13.m_begin = (iterator)&local_2b0;
  msg_13.m_end = pvVar2;
  msg_13.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_2c0,
             msg_13);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 2;
  local_100._0_4_ = 2;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10427,(size_t)&local_60,0x5e,&local_80,"2U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x5f;
  file_14.m_begin = (iterator)&local_2d0;
  msg_14.m_end = pvVar2;
  msg_14.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_2e0,
             msg_14);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 4;
  local_100._0_4_ = 4;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10455,(size_t)&local_60,0x5f,&local_80,"4U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x60;
  file_15.m_begin = (iterator)&local_2f0;
  msg_15.m_end = pvVar2;
  msg_15.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_300,
             msg_15);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 4;
  local_100._0_4_ = 4;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10483,(size_t)&local_60,0x60,&local_80,"4U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x61;
  file_16.m_begin = (iterator)&local_310;
  msg_16.m_end = pvVar2;
  msg_16.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_320,
             msg_16);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 8;
  local_100._0_4_ = 8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf104b1,(size_t)&local_60,0x61,&local_80,"8U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x62;
  file_17.m_begin = (iterator)&local_330;
  msg_17.m_end = pvVar2;
  msg_17.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_340,
             msg_17);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 8;
  local_100._0_4_ = 8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf104df,(size_t)&local_60,0x62,&local_80,"8U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x63;
  file_18.m_begin = (iterator)&local_350;
  msg_18.m_end = pvVar2;
  msg_18.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_360,
             msg_18);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 1;
  local_100._0_4_ = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf104fd,(size_t)&local_60,99,&local_80,"1U",&local_a8)
  ;
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x64;
  file_19.m_begin = (iterator)&local_370;
  msg_19.m_end = pvVar2;
  msg_19.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_380,
             msg_19);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 1;
  local_100._0_4_ = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10517,(size_t)&local_60,100,&local_80,"1U",&local_a8
            );
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x65;
  file_20.m_begin = (iterator)&local_390;
  msg_20.m_end = pvVar2;
  msg_20.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_3a0,
             msg_20);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = 2;
  local_100 = CONCAT44(local_100._4_4_,2);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013ae0c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_100;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae108;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf10543,(size_t)&local_60,0x65,&local_80,"2U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sizes)
{
    BOOST_CHECK_EQUAL(sizeof(unsigned char), GetSerializeSize((unsigned char)0));
    BOOST_CHECK_EQUAL(sizeof(int8_t), GetSerializeSize(int8_t(0)));
    BOOST_CHECK_EQUAL(sizeof(uint8_t), GetSerializeSize(uint8_t(0)));
    BOOST_CHECK_EQUAL(sizeof(int16_t), GetSerializeSize(int16_t(0)));
    BOOST_CHECK_EQUAL(sizeof(uint16_t), GetSerializeSize(uint16_t(0)));
    BOOST_CHECK_EQUAL(sizeof(int32_t), GetSerializeSize(int32_t(0)));
    BOOST_CHECK_EQUAL(sizeof(uint32_t), GetSerializeSize(uint32_t(0)));
    BOOST_CHECK_EQUAL(sizeof(int64_t), GetSerializeSize(int64_t(0)));
    BOOST_CHECK_EQUAL(sizeof(uint64_t), GetSerializeSize(uint64_t(0)));
    // Bool is serialized as uint8_t
    BOOST_CHECK_EQUAL(sizeof(uint8_t), GetSerializeSize(bool(0)));

    // Sanity-check GetSerializeSize and c++ type matching
    BOOST_CHECK_EQUAL(GetSerializeSize((unsigned char)0), 1U);
    BOOST_CHECK_EQUAL(GetSerializeSize(int8_t(0)), 1U);
    BOOST_CHECK_EQUAL(GetSerializeSize(uint8_t(0)), 1U);
    BOOST_CHECK_EQUAL(GetSerializeSize(int16_t(0)), 2U);
    BOOST_CHECK_EQUAL(GetSerializeSize(uint16_t(0)), 2U);
    BOOST_CHECK_EQUAL(GetSerializeSize(int32_t(0)), 4U);
    BOOST_CHECK_EQUAL(GetSerializeSize(uint32_t(0)), 4U);
    BOOST_CHECK_EQUAL(GetSerializeSize(int64_t(0)), 8U);
    BOOST_CHECK_EQUAL(GetSerializeSize(uint64_t(0)), 8U);
    BOOST_CHECK_EQUAL(GetSerializeSize(bool(0)), 1U);
    BOOST_CHECK_EQUAL(GetSerializeSize(std::array<uint8_t, 1>{0}), 1U);
    BOOST_CHECK_EQUAL(GetSerializeSize(std::array<uint8_t, 2>{0, 0}), 2U);
}